

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O3

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++:548:3)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_disk_test_c__:548:3)>
      *this)

{
  Directory *pDVar1;
  String *pSVar2;
  size_t sVar3;
  long *plVar4;
  StringPtr name;
  Path local_38;
  undefined8 *local_20;
  long *local_18;
  
  pDVar1 = ((this->func).dir)->ptr;
  name.content.size_ = 4;
  name.content.ptr = "foo";
  Path::Path(&local_38,name);
  (*(pDVar1->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xd])
            (&local_20,pDVar1,local_38.parts.ptr,local_38.parts.size_,7);
  plVar4 = local_18;
  if (local_18 != (long *)0x0) {
    local_18 = (long *)0x0;
    (**(code **)*local_20)(local_20,(long)plVar4 + *(long *)(*plVar4 + -0x10));
  }
  sVar3 = local_38.parts.size_;
  pSVar2 = local_38.parts.ptr;
  if (local_38.parts.ptr != (String *)0x0) {
    local_38.parts.ptr = (String *)0x0;
    local_38.parts.size_ = 0;
    (**(local_38.parts.disposer)->_vptr_ArrayDisposer)
              (local_38.parts.disposer,pSVar2,0x18,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  return;
}

Assistant:

void run() override {
    func();
  }